

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

void * tdefl_write_image_to_png_file_in_memory_ex
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out,mz_uint level,mz_bool flip
                 )

{
  tdefl_compressor *__ptr;
  int iVar1;
  int iVar2;
  int iVar3;
  tdefl_status tVar4;
  mz_bool mVar5;
  tdefl_compressor *ptVar6;
  ulong uVar7;
  size_t sVar8;
  mz_ulong mVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int local_bc;
  tdefl_compressor *local_b8;
  int local_b0;
  int local_ac;
  tdefl_output_buffer out_buf;
  mz_uint8 pnghdr [41];
  
  ptVar6 = (tdefl_compressor *)malloc(0x4df78);
  *pLen_out = 0;
  if (ptVar6 != (tdefl_compressor *)0x0) {
    iVar1 = num_chans * w;
    out_buf.m_pBuf = (mz_uint8 *)0x0;
    out_buf.m_size = 0;
    out_buf.m_expandable = 1;
    out_buf._28_4_ = 0;
    iVar2 = (iVar1 + 1) * h;
    iVar11 = 0x40;
    if (0x40 < iVar2) {
      iVar11 = iVar2;
    }
    out_buf.m_capacity = (size_t)(iVar11 + 0x39);
    local_ac = w;
    out_buf.m_pBuf = (mz_uint8 *)malloc(out_buf.m_capacity);
    if (out_buf.m_pBuf != (mz_uint8 *)0x0) {
      local_b8 = ptVar6;
      local_b0 = num_chans;
      local_bc = 0x29;
      while (iVar11 = local_bc + -1, local_bc != 0) {
        tdefl_output_buffer_putter(&local_bc,1,&out_buf);
        local_bc = iVar11;
      }
      uVar7 = 10;
      if (level < 10) {
        uVar7 = (ulong)level;
      }
      tdefl_init(local_b8,tdefl_output_buffer_putter,&out_buf,
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar7] | 0x1000)
      ;
      ptVar6 = local_b8;
      iVar2 = 0;
      iVar11 = 0;
      if (0 < h) {
        iVar11 = h;
      }
      iVar12 = h;
      for (; __ptr = local_b8, iVar12 = iVar12 + -1, iVar11 != iVar2; iVar2 = iVar2 + 1) {
        tdefl_compress_buffer(ptVar6,&local_bc,1,TDEFL_NO_FLUSH);
        iVar3 = iVar12;
        if (flip == 0) {
          iVar3 = iVar2;
        }
        tdefl_compress_buffer
                  (ptVar6,(void *)((long)(iVar3 * iVar1) + (long)pImage),(long)iVar1,TDEFL_NO_FLUSH)
        ;
      }
      tVar4 = tdefl_compress_buffer(local_b8,(void *)0x0,0,TDEFL_FINISH);
      if (tVar4 == TDEFL_STATUS_DONE) {
        sVar8 = out_buf.m_size - 0x29;
        *pLen_out = sVar8;
        pnghdr[0x18] = '\b';
        pnghdr[0x1a] = '\0';
        pnghdr[0x1b] = '\0';
        pnghdr[0x1c] = '\0';
        pnghdr[0x1d] = '\0';
        pnghdr[0x1e] = '\0';
        pnghdr[0x1f] = '\0';
        pnghdr[0x20] = '\0';
        pnghdr[0] = 0x89;
        pnghdr[1] = 'P';
        pnghdr[2] = 'N';
        pnghdr[3] = 'G';
        pnghdr[4] = '\r';
        pnghdr[5] = '\n';
        pnghdr[6] = '\x1a';
        pnghdr[7] = '\n';
        pnghdr[8] = '\0';
        pnghdr[9] = '\0';
        pnghdr[10] = '\0';
        pnghdr[0xb] = '\r';
        pnghdr[0xc] = 'I';
        pnghdr[0xd] = 'H';
        pnghdr[0xe] = 'D';
        pnghdr[0xf] = 'R';
        pnghdr._16_6_ = (uint6)CONCAT11((char)local_ac,(char)((uint)local_ac >> 8)) << 0x10;
        pnghdr[0x16] = (mz_uint8)((uint)h >> 8);
        pnghdr[0x17] = (mz_uint8)h;
        pnghdr[0x19] = ""[local_b0];
        pnghdr[0x22] = (mz_uint8)(sVar8 >> 0x10);
        pnghdr[0x21] = (mz_uint8)(sVar8 >> 0x18);
        pnghdr[0x23] = (mz_uint8)(sVar8 >> 8);
        pnghdr[0x24] = (mz_uint8)sVar8;
        builtin_memcpy(pnghdr + 0x25,"IDAT",4);
        mVar9 = mz_crc32(0,pnghdr + 0xc,0x11);
        for (lVar10 = 0x1d; lVar10 != 0x21; lVar10 = lVar10 + 1) {
          pnghdr[lVar10] = (mz_uint8)(mVar9 >> 0x18);
          mVar9 = (mz_ulong)(uint)((int)mVar9 << 8);
        }
        *(ulong *)(out_buf.m_pBuf + 0x19) =
             CONCAT17(pnghdr[0x20],CONCAT61(pnghdr._26_6_,pnghdr[0x19]));
        *(undefined8 *)(out_buf.m_pBuf + 0x21) = pnghdr._33_8_;
        *(undefined8 *)(out_buf.m_pBuf + 0x10) = pnghdr._16_8_;
        *(ulong *)(out_buf.m_pBuf + 0x18) =
             CONCAT62(pnghdr._26_6_,CONCAT11(pnghdr[0x19],pnghdr[0x18]));
        *(undefined8 *)out_buf.m_pBuf = pnghdr._0_8_;
        *(undefined8 *)(out_buf.m_pBuf + 8) = pnghdr._8_8_;
        mVar5 = tdefl_output_buffer_putter("",0x10,&out_buf);
        if (mVar5 != 0) {
          mVar9 = mz_crc32(0,out_buf.m_pBuf + 0x25,*pLen_out + 4);
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            out_buf.m_pBuf[lVar10 + -0x10 + out_buf.m_size] = (mz_uint8)(mVar9 >> 0x18);
            mVar9 = (mz_ulong)(uint)((int)mVar9 << 8);
          }
          *pLen_out = *pLen_out + 0x39;
          free(__ptr);
          return out_buf.m_pBuf;
        }
        *pLen_out = 0;
      }
      free(__ptr);
      ptVar6 = (tdefl_compressor *)out_buf.m_pBuf;
    }
    free(ptVar6);
  }
  return (void *)0x0;
}

Assistant:

void *tdefl_write_image_to_png_file_in_memory_ex(const void *pImage, int w,
                                                 int h, int num_chans,
                                                 size_t *pLen_out,
                                                 mz_uint level, mz_bool flip) {
  /* Using a local copy of this array here in case MINIZ_NO_ZLIB_APIS was
   * defined. */
  static const mz_uint s_tdefl_png_num_probes[11] = {
      0, 1, 6, 32, 16, 32, 128, 256, 512, 768, 1500};
  tdefl_compressor *pComp =
      (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor));
  tdefl_output_buffer out_buf;
  int i, bpl = w * num_chans, y, z;
  mz_uint32 c;
  *pLen_out = 0;
  if (!pComp)
    return NULL;
  MZ_CLEAR_OBJ(out_buf);
  out_buf.m_expandable = MZ_TRUE;
  out_buf.m_capacity = 57 + MZ_MAX(64, (1 + bpl) * h);
  if (NULL == (out_buf.m_pBuf = (mz_uint8 *)MZ_MALLOC(out_buf.m_capacity))) {
    MZ_FREE(pComp);
    return NULL;
  }
  /* write dummy header */
  for (z = 41; z; --z)
    tdefl_output_buffer_putter(&z, 1, &out_buf);
  /* compress image data */
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf,
             s_tdefl_png_num_probes[MZ_MIN(10, level)] |
                 TDEFL_WRITE_ZLIB_HEADER);
  for (y = 0; y < h; ++y) {
    tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH);
    tdefl_compress_buffer(pComp,
                          (mz_uint8 *)pImage + (flip ? (h - 1 - y) : y) * bpl,
                          bpl, TDEFL_NO_FLUSH);
  }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) !=
      TDEFL_STATUS_DONE) {
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  /* write real header */
  *pLen_out = out_buf.m_size - 41;
  {
    static const mz_uint8 chans[] = {0x00, 0x00, 0x04, 0x02, 0x06};
    mz_uint8 pnghdr[41] = {0x89, 0x50, 0x4e, 0x47, 0x0d, 0x0a, 0x1a, 0x0a, 0x00,
                           0x00, 0x00, 0x0d, 0x49, 0x48, 0x44, 0x52, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x08, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x49, 0x44, 0x41, 0x54};
    pnghdr[18] = (mz_uint8)(w >> 8);
    pnghdr[19] = (mz_uint8)w;
    pnghdr[22] = (mz_uint8)(h >> 8);
    pnghdr[23] = (mz_uint8)h;
    pnghdr[25] = chans[num_chans];
    pnghdr[33] = (mz_uint8)(*pLen_out >> 24);
    pnghdr[34] = (mz_uint8)(*pLen_out >> 16);
    pnghdr[35] = (mz_uint8)(*pLen_out >> 8);
    pnghdr[36] = (mz_uint8)*pLen_out;
    c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, pnghdr + 12, 17);
    for (i = 0; i < 4; ++i, c <<= 8)
      ((mz_uint8 *)(pnghdr + 29))[i] = (mz_uint8)(c >> 24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  /* write footer (IDAT CRC-32, followed by IEND chunk) */
  if (!tdefl_output_buffer_putter(
          "\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) {
    *pLen_out = 0;
    MZ_FREE(pComp);
    MZ_FREE(out_buf.m_pBuf);
    return NULL;
  }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT, out_buf.m_pBuf + 41 - 4,
                          *pLen_out + 4);
  for (i = 0; i < 4; ++i, c <<= 8)
    (out_buf.m_pBuf + out_buf.m_size - 16)[i] = (mz_uint8)(c >> 24);
  /* compute final size of file, grab compressed data buffer and return */
  *pLen_out += 57;
  MZ_FREE(pComp);
  return out_buf.m_pBuf;
}